

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O1

archive * archive_write_new(void)

{
  archive *__ptr;
  char *pcVar1;
  
  __ptr = (archive *)calloc(1,0x158);
  if (__ptr != (archive *)0x0) {
    __ptr->magic = 0xb0c5c0de;
    __ptr->state = 1;
    __ptr->vtable = &archive_write_vtable;
    __ptr[1].current_codepage = 0x2800;
    __ptr[1].current_oemcp = 0xffffffff;
    __ptr[1].file_count = 0x400;
    __ptr[1].archive_error_number = 0;
    pcVar1 = (char *)calloc(1,0x400);
    if (pcVar1 != (char *)0x0) {
      __ptr[1].archive_format_name = pcVar1;
      return __ptr;
    }
    free(__ptr);
  }
  return (archive *)0x0;
}

Assistant:

struct archive *
archive_write_new(void)
{
	struct archive_write *a;
	unsigned char *nulls;

	a = (struct archive_write *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_WRITE_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = &archive_write_vtable;
	/*
	 * The value 10240 here matches the traditional tar default,
	 * but is otherwise arbitrary.
	 * TODO: Set the default block size from the format selected.
	 */
	a->bytes_per_block = 10240;
	a->bytes_in_last_block = -1;	/* Default */

	/* Initialize a block of nulls for padding purposes. */
	a->null_length = 1024;
	nulls = (unsigned char *)calloc(1, a->null_length);
	if (nulls == NULL) {
		free(a);
		return (NULL);
	}
	a->nulls = nulls;
	return (&a->archive);
}